

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayImageTextureSize.cpp
# Opt level: O2

void __thiscall
glcts::TextureCubeMapArrayTextureSizeRTFragmentShader::configureProgram
          (TextureCubeMapArrayTextureSizeRTFragmentShader *this)

{
  bool bVar1;
  int iVar2;
  GLuint GVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  TestError *this_00;
  char *fsCode;
  char *vsCode;
  long lVar5;
  
  iVar2 = (*((this->super_TextureCubeMapArrayTextureSizeRTBase).
             super_TextureCubeMapArrayTextureSizeBase.super_TestCaseBase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar2);
  vsCode = 
  "${VERSION}\n\nprecision highp float;\n\nvoid main()\n{\n    gl_PointSize = 1.0f;\n    gl_Position = vec4(0, 0, 0, 1.0f);\n}\n"
  ;
  fsCode = 
  "${VERSION}\n\n${TEXTURE_CUBE_MAP_ARRAY_REQUIRE}\n\nprecision highp float;\n\nuniform highp samplerCubeArray       texture_std_sampler;\nuniform highp samplerCubeArrayShadow texture_shw_sampler;\n\nlayout (location = 0) out uvec4 texture_std_size;\nlayout (location = 1) out uvec4 texture_shw_size;\n\nvoid main()\n{\n    texture_std_size = uvec4( textureSize(texture_std_sampler, 0), 0 );\n    texture_shw_size = uvec4( textureSize(texture_shw_sampler, 0), 0 );\n}\n"
  ;
  GVar3 = (**(code **)(lVar5 + 0x3f0))(0x8b31);
  this->m_vs_id = GVar3;
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"Could not create shader object.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageTextureSize.cpp"
                  ,0x536);
  GVar3 = (**(code **)(lVar5 + 0x3f0))(0x8b30);
  this->m_fs_id = GVar3;
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"Could not create shader object.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageTextureSize.cpp"
                  ,0x538);
  bVar1 = TestCaseBase::buildProgram
                    ((TestCaseBase *)this,
                     (this->super_TextureCubeMapArrayTextureSizeRTBase).
                     super_TextureCubeMapArrayTextureSizeBase.m_po_id,this->m_fs_id,1,&fsCode,
                     this->m_vs_id,1,&vsCode,(bool *)0x0);
  if (bVar1) {
    return;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Could not compile/link program object from valid shader code.",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageTextureSize.cpp"
             ,0x53c);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void TextureCubeMapArrayTextureSizeRTFragmentShader::configureProgram(void)
{
	/* Get GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	const char* vsCode = getVertexShaderCode();
	const char* fsCode = getFragmentShaderCode();

	m_vs_id = gl.createShader(GL_VERTEX_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create shader object.");
	m_fs_id = gl.createShader(GL_FRAGMENT_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create shader object.");

	if (!buildProgram(m_po_id, m_fs_id, 1 /* part */, &fsCode, m_vs_id, 1 /* part */, &vsCode))
	{
		TCU_FAIL("Could not compile/link program object from valid shader code.");
	}
}